

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

Entry * __thiscall
cali::Caliper::get(Entry *__return_storage_ptr__,Caliper *this,ChannelBody *chB,Attribute *attr)

{
  siglock *psVar1;
  ThreadData *pTVar2;
  uint uVar3;
  cali_id_t key;
  Entry local_48;
  
  if (attr->m_node == (Node *)0x0) {
    key = 0xffffffffffffffff;
  }
  else {
    key = attr->m_node->m_id;
  }
  uVar3 = Attribute::properties(attr);
  pTVar2 = this->sT;
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + 1;
  std::mutex::lock(&chB->channel_blackboard_lock);
  if ((uVar3 & 1) == 0) {
    key = (ulong)((uVar3 >> 10 & 1) != 0) + 1;
  }
  Blackboard::get(&local_48,&chB->channel_blackboard,key);
  Entry::get(__return_storage_ptr__,&local_48,attr);
  pthread_mutex_unlock((pthread_mutex_t *)&chB->channel_blackboard_lock);
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + -1;
  return __return_storage_ptr__;
}

Assistant:

Entry Caliper::get(ChannelBody* chB, const Attribute& attr)
{
    cali_id_t key = get_blackboard_key(attr.id(), attr.properties());

    std::lock_guard<::siglock> g(sT->lock);
    std::lock_guard<std::mutex> gbb(chB->channel_blackboard_lock);

    return chB->channel_blackboard.get(key).get(attr);
}